

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

void fmt::v5::internal::
     value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
     ::
     format_custom_arg<fmt::v5::arg_join<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>,char>>
               (void *arg,
               basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
               *ctx)

{
  size_t *psVar1;
  char *pcVar2;
  char *pcVar3;
  iterator iVar4;
  specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>
  handler;
  error_handler local_89;
  specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>
  local_88;
  dynamic_format_specs<char> local_68;
  
  local_88.
  super_dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>
  .super_specs_setter<char>.specs_ = &local_68.super_basic_format_specs<char>;
  local_68.super_basic_format_specs<char>.super_align_spec.width_ = 0;
  local_68.super_basic_format_specs<char>.super_align_spec.fill_ = L' ';
  local_68.super_basic_format_specs<char>.super_align_spec.align_ = ALIGN_DEFAULT;
  local_68.super_basic_format_specs<char>.super_core_format_specs.precision = -1;
  local_68.super_basic_format_specs<char>.super_core_format_specs.flags = '\0';
  local_68.super_basic_format_specs<char>.super_core_format_specs.type = '\0';
  local_68.width_ref.kind = NONE;
  local_68.width_ref.field_1.index = 0;
  local_68.precision_ref.kind = NONE;
  local_68.precision_ref.field_1.index = 0;
  local_88.arg_type_ = double_type;
  pcVar3 = (ctx->
           super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
           ).parse_context_.format_str_.data_;
  local_88.
  super_dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>
  .specs_ = (dynamic_format_specs<char> *)
            local_88.
            super_dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>
            .super_specs_setter<char>.specs_;
  local_88.
  super_dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>
  .context_ = (basic_parse_context<char,_fmt::v5::internal::error_handler> *)ctx;
  pcVar3 = parse_format_specs<char,fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,fmt::v5::internal::error_handler>>>&>
                     (pcVar3,pcVar3 + (ctx->
                                      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
                                      ).parse_context_.format_str_.size_,&local_88);
  if (((0x26 < (byte)local_68.super_basic_format_specs<char>.super_core_format_specs.type - 0x41) ||
      ((0x7100000071U >>
        ((ulong)((byte)local_68.super_basic_format_specs<char>.super_core_format_specs.type - 0x41)
        & 0x3f) & 1) == 0)) &&
     (local_68.super_basic_format_specs<char>.super_core_format_specs.type != 0)) {
    error_handler::on_error(&local_89,"invalid type specifier");
  }
  pcVar2 = (ctx->
           super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
           ).parse_context_.format_str_.data_;
  (ctx->
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
  ).parse_context_.format_str_.data_ = pcVar3;
  psVar1 = &(ctx->
            super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
            ).parse_context_.format_str_.size_;
  *psVar1 = (size_t)(pcVar2 + (*psVar1 - (long)pcVar3));
  iVar4 = formatter<fmt::v5::arg_join<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>,char>,char,void>
          ::
          format<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                    ((formatter<fmt::v5::arg_join<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>,char>,char,void>
                      *)&local_68,
                     (arg_join<__gnu_cxx::__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>,_char>
                      *)arg,ctx);
  (ctx->
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
  ).out_.container = iVar4.container;
  return;
}

Assistant:

static void format_custom_arg(const void *arg, Context &ctx) {
    // Get the formatter type through the context to allow different contexts
    // have different extension points, e.g. `formatter<T>` for `format` and
    // `printf_formatter<T>` for `printf`.
    typename Context::template formatter_type<T>::type f;
    auto &&parse_ctx = ctx.parse_context();
    parse_ctx.advance_to(f.parse(parse_ctx));
    ctx.advance_to(f.format(*static_cast<const T*>(arg), ctx));
  }